

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_array.c
# Opt level: O0

void garray_arrayviewlist_new(_garray *x)

{
  int iVar1;
  t_word *local_20;
  t_word *data;
  _garray *p_Stack_10;
  int size;
  _garray *x_local;
  
  data._4_4_ = 0;
  local_20 = (t_word *)0x0;
  p_Stack_10 = x;
  iVar1 = garray_getfloatwords(x,(int *)((long)&data + 4),&local_20);
  if (iVar1 == 0) {
    pd_error(p_Stack_10,"error in %s()","garray_arrayviewlist_new");
  }
  else {
    p_Stack_10->field_0x30 = p_Stack_10->field_0x30 & 0xf7 | 8;
    pdgui_stub_vnew((t_pd *)p_Stack_10,"pdtk_array_listview_new",p_Stack_10,"si",
                    p_Stack_10->x_realname->s_name,0);
    garray_arrayviewlist_fillpage(p_Stack_10,0.0,0.0);
  }
  return;
}

Assistant:

static void garray_arrayviewlist_new(t_garray *x)
{
    int size=0;
    t_word*data=0;

    if(!garray_getfloatwords(x, &size, &data)) {
        pd_error(x, "error in %s()", __FUNCTION__);
        return;
    }
    x->x_listviewing = 1;

    pdgui_stub_vnew(&x->x_gobj.g_pd,
        "pdtk_array_listview_new", x,
        "si",
        x->x_realname->s_name, 0);

    garray_arrayviewlist_fillpage(x, 0, 0);
}